

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmsockets.c
# Opt level: O0

socket_conn_data_ptr create_socket_conn_data(CMtrans_services_conflict svc)

{
  socket_conn_data_ptr __s;
  undefined8 *in_RDI;
  socket_conn_data_ptr socket_conn_data;
  
  __s = (socket_conn_data_ptr)(*(code *)*in_RDI)(0x28);
  memset(__s,0,0x28);
  __s->remote_contact_port = -1;
  __s->fd = 0;
  __s->block_state = Block;
  return __s;
}

Assistant:

static socket_conn_data_ptr 
create_socket_conn_data(CMtrans_services svc)
{
    socket_conn_data_ptr socket_conn_data =
    svc->malloc_func(sizeof(struct socket_connection_data));
    memset(socket_conn_data, 0, sizeof(struct socket_connection_data));
    socket_conn_data->remote_contact_port = -1;
    socket_conn_data->fd = 0;
    socket_conn_data->block_state = Block;
    return socket_conn_data;
}